

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Stack.h
# Opt level: O2

void __thiscall w3Stack::DumpStack(w3Stack *this,PCSTR prefix)

{
  long lVar1;
  PCSTR pcVar2;
  long lVar3;
  bool bVar4;
  
  lVar1 = ((long)(this->super_w3StackBase).super_w3StackBaseBase.
                 super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->super_w3StackBase).super_w3StackBaseBase.
                super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x30;
  printf("stack@%s: %lX ",prefix,lVar1);
  lVar3 = 0;
  while (bVar4 = lVar1 != 0, lVar1 = lVar1 + -1, bVar4) {
    pcVar2 = TagToString((uint)*(byte *)((long)&((this->super_w3StackBase).super_w3StackBaseBase.
                                                 super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->tag +
                                        lVar3));
    printf("%s:",pcVar2);
    putchar(0x20);
    lVar3 = lVar3 + 0x30;
  }
  putchar(10);
  return;
}

Assistant:

void DumpStack (PCSTR prefix)
    {
        const size_t n = size ();
        printf ("stack@%s: %" FORMAT_SIZE "X ", prefix, n);
        for (size_t i = 0; i != n; ++i)
        {
            printf ("%s:", TagToString (begin () [(ssize_t)i].tag));
            switch (begin () [(ssize_t)i].tag)
            {
            case Tag_Label:
                break;
            case Tag_Frame:
                break;
            case Tag_Value:
                printf ("%s", TagToString (begin () [(ssize_t)i].value.tag));
                break;
            default:; //todo
            }
            printf (" ");
        }
        printf ("\n");
    }